

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void x86_stw_phys_x86_64(CPUState *cs,hwaddr addr,uint32_t val)

{
  MemTxAttrs attrs_00;
  AddressSpace *as_00;
  AddressSpace *as;
  MemTxAttrs attrs;
  CPUX86State *env;
  X86CPU *cpu;
  uint32_t val_local;
  hwaddr addr_local;
  CPUState *cs_local;
  
  attrs_00 = cpu_get_mem_attrs((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb));
  as_00 = cpu_addressspace(cs,attrs_00);
  address_space_stw_x86_64
            ((uc_struct_conflict *)as_00->uc,as_00,addr,val,attrs_00,(MemTxResult *)0x0);
  return;
}

Assistant:

void x86_stw_phys(CPUState *cs, hwaddr addr, uint32_t val)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    MemTxAttrs attrs = cpu_get_mem_attrs(env);
    AddressSpace *as = cpu_addressspace(cs, attrs);

#ifdef UNICORN_ARCH_POSTFIX
    glue(address_space_stw,UNICORN_ARCH_POSTFIX)(as->uc, as, addr, val, attrs, NULL);
#else
    address_space_stw(as->uc, as, addr, val, attrs, NULL);
#endif
}